

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteStates::AddState(MADPComponentDiscreteStates *this,string *StateName)

{
  pointer pdVar1;
  size_t sVar2;
  StateDistributionVector *pSVar3;
  allocator<char> local_99;
  string local_98;
  StateDiscrete local_78;
  
  pSVar3 = this->_m_initialStateDistribution;
  if (pSVar3 == (StateDistributionVector *)0x0) {
    pSVar3 = (StateDistributionVector *)operator_new(0x20);
    (pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar3->super_StateDistribution)._vptr_StateDistribution =
         (_func_int **)&PTR__StateDistributionVector_005d38d8;
    this->_m_initialStateDistribution = pSVar3;
  }
  if (this->_m_initialized == false) {
    this->_m_nrStates = 0;
    pdVar1 = (pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (pSVar3->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
    std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::clear(&this->_m_stateVec);
    this->_m_initialized = true;
  }
  sVar2 = this->_m_nrStates;
  this->_m_nrStates = sVar2 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"undefined",&local_99);
  StateDiscrete::StateDiscrete(&local_78,(Index)sVar2,StateName,&local_98);
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::emplace_back<StateDiscrete>
            (&this->_m_stateVec,&local_78);
  NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_78.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->_m_initialStateDistribution->super_SDV,(double *)&local_78);
  return;
}

Assistant:

void MADPComponentDiscreteStates::AddState(const string &StateName)
{
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();
    
    if(!_m_initialized)
    {
        _m_nrStates=0;    
        _m_initialStateDistribution->clear();
        _m_stateVec.clear();

        _m_initialized = true;
    }        
    _m_stateVec.push_back(StateDiscrete( _m_nrStates++, StateName));
    _m_initialStateDistribution->push_back(0.0);
//    _m_nrStates++; - already done...
}